

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManFlowMinCut(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar2;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMinCut;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  p_00 = Vec_PtrAlloc(iVar1);
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_24) {
      return p_00;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (((pObj_00 != (Aig_Obj_t *)0x0) &&
        (pAVar2 = Llb_ObjGetPath(pObj_00), pAVar2 != (Aig_Obj_t *)0x0)) &&
       (iVar1 = Aig_ObjIsTravIdCurrent(p,pObj_00), iVar1 != 0)) {
      if ((*(ulong *)&pObj_00->field_0x18 >> 4 & 1) == 0) {
        pAVar2 = Llb_ObjGetPath(pObj_00);
        iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar2);
        if (iVar1 != 0) goto LAB_00a8fca3;
      }
      Vec_PtrPush(p_00,pObj_00);
    }
LAB_00a8fca3:
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManFlowMinCut( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    // collect the cut nodes
    vMinCut = Vec_PtrAlloc( Aig_ManRegNum(p) );
    Aig_ManForEachObj( p, pObj, i )
    {
        // node without flow is not a cut node
        if ( !Llb_ObjGetPath(pObj) )
            continue;
        // unvisited node is below the cut
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        // add terminal with flow or node whose path is not visited
        if ( pObj->fMarkA || !Aig_ObjIsTravIdCurrent( p, Llb_ObjGetPath(pObj) ) )
            Vec_PtrPush( vMinCut, pObj );
    }
    return vMinCut;
}